

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O3

bool __thiscall Pig::getUntil(Pig *this,int end,string *result)

{
  ulong uVar1;
  uint uVar2;
  string *input;
  ulong uVar3;
  long *local_50 [2];
  long local_40 [2];
  
  input = (this->_text).
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr;
  uVar1 = this->_cursor;
  uVar3 = uVar1;
  while( true ) {
    uVar2 = utf8_next_char(input,&this->_cursor);
    if (uVar2 == 0) {
      return uVar1 < this->_cursor;
    }
    if (uVar2 == end) break;
    input = (this->_text).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
    uVar3 = this->_cursor;
    if ((input->_M_dataplus)._M_p[uVar3] == '\0') {
LAB_00170b00:
      std::__cxx11::string::substr((ulong)local_50,(ulong)input);
      std::__cxx11::string::operator=((string *)result,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      return true;
    }
  }
  this->_cursor = uVar3;
  input = (this->_text).
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr;
  goto LAB_00170b00;
}

Assistant:

bool Pig::getUntil (int end, std::string& result)
{
  auto save = _cursor;

  int c;
  auto prev = _cursor;
  while ((c = utf8_next_char (*_text, _cursor)))
  {
    if (c == end)
    {
      _cursor = prev;
      result = _text->substr (save, _cursor - save);
      return true;
    }

    else if (eos ())
    {
      result = _text->substr (save, _cursor - save);
      return true;
    }

    prev = _cursor;
  }

  return _cursor > save;
}